

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.hpp
# Opt level: O0

void __thiscall
EOServer::EOServer(EOServer *this,IPAddress addr,unsigned_short port,
                  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                  *dbinfo,Config *eoserv_config,Config *admin_config)

{
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
  local_f8;
  Config *local_38;
  Config *admin_config_local;
  Config *eoserv_config_local;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
  *dbinfo_local;
  EOServer *pEStack_18;
  unsigned_short port_local;
  EOServer *this_local;
  IPAddress addr_local;
  
  local_38 = admin_config;
  admin_config_local = eoserv_config;
  eoserv_config_local = (Config *)dbinfo;
  dbinfo_local._6_2_ = port;
  pEStack_18 = this;
  this_local._4_4_ = addr.address;
  Server::Server(&this->super_Server,(IPAddress *)((long)&this_local + 4),port);
  (this->super_Server)._vptr_Server = (_func_int **)&PTR_ClientFactory_002c5810;
  std::
  unordered_map<IPAddress,_ConnectionLogEntry,_std::hash<IPAddress>,_std::equal_to<IPAddress>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>_>
  ::unordered_map(&this->connection_log);
  this->ping_timer = (TimeEvent *)0x0;
  this->QuietConnectionErrors = false;
  this->HangupDelay = 10.0;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
  array(&local_f8,dbinfo);
  Initialize(this,&local_f8,admin_config_local,local_38);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
  ~array(&local_f8);
  return;
}

Assistant:

EOServer(IPAddress addr, unsigned short port, std::array<std::string, 6> dbinfo, const Config &eoserv_config, const Config &admin_config) : Server(addr, port)
		{
			this->Initialize(dbinfo, eoserv_config, admin_config);
		}